

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O0

int ncnn::binary_op_broadcast_inner<ncnn::binary_op_atan2>(Mat *a,Mat *b,Mat *c,Option *opt)

{
  long *in_RDX;
  long *in_RSI;
  float *x_00;
  long *in_RDI;
  float fVar1;
  int x_3;
  float b0_4;
  int y_3;
  int z_1;
  float *outptr_4;
  float *ptr1_2;
  float *ptr_4;
  int q_3;
  int x_2;
  int y_2;
  float b0_3;
  int z;
  float *outptr_3;
  float *ptr1_1;
  float *ptr_3;
  int q_2;
  int x_1;
  float b0_2;
  int y_1;
  float *outptr_2;
  float *ptr1;
  float *ptr_2;
  int q_1;
  int i;
  float *outptr_1;
  float b0_1;
  float *ptr_1;
  int q;
  int x;
  float *outptr;
  float b0;
  float *ptr;
  int y;
  int size;
  int channels;
  int d;
  int h;
  int w;
  binary_op_atan2 op;
  Mat *m_7;
  Mat *m_6;
  Mat *m_4;
  Mat *m_2;
  Mat *m;
  Mat *m_8;
  Mat *m_5;
  Mat *m_3;
  Mat *m_1;
  float *in_stack_fffffffffffff4c8;
  binary_op_atan2 *in_stack_fffffffffffff4d0;
  binary_op_atan2 *this;
  int local_9d0;
  int local_9c8;
  int local_9c4;
  undefined8 local_9c0;
  undefined8 local_9b8;
  undefined8 local_9b0;
  undefined4 local_9a8;
  long local_9a0;
  undefined4 local_998;
  undefined4 local_994;
  undefined4 local_990;
  undefined4 local_98c;
  undefined4 local_988;
  undefined8 local_980;
  float *local_978;
  undefined8 local_970;
  undefined8 local_968;
  undefined8 local_960;
  undefined4 local_958;
  long local_950;
  undefined4 local_948;
  undefined4 local_944;
  undefined4 local_940;
  undefined4 local_93c;
  undefined4 local_938;
  undefined8 local_930;
  long local_928;
  undefined8 local_920;
  undefined8 local_918;
  undefined8 local_910;
  undefined4 local_908;
  long local_900;
  undefined4 local_8f8;
  undefined4 local_8f4;
  undefined4 local_8f0;
  undefined4 local_8ec;
  undefined4 local_8e8;
  undefined8 local_8e0;
  long local_8d8;
  int local_8cc;
  int local_8c8;
  int local_8c4;
  undefined4 local_8c0;
  int local_8bc;
  undefined8 local_8b8;
  undefined8 local_8b0;
  undefined8 local_8a8;
  undefined4 local_8a0;
  long local_898;
  undefined4 local_890;
  undefined4 local_88c;
  undefined4 local_888;
  undefined4 local_884;
  undefined4 local_880;
  undefined8 local_878;
  long local_870;
  long local_868;
  undefined8 local_860;
  undefined8 local_858;
  undefined8 local_850;
  undefined4 local_848;
  long local_840;
  undefined4 local_838;
  undefined4 local_834;
  undefined4 local_830;
  undefined4 local_82c;
  undefined4 local_828;
  undefined8 local_820;
  long local_818;
  int local_810;
  int local_80c;
  undefined4 local_808;
  int local_804;
  undefined8 local_800;
  undefined8 local_7f8;
  undefined8 local_7f0;
  undefined4 local_7e8;
  long local_7e0;
  undefined4 local_7d8;
  undefined4 local_7d4;
  undefined4 local_7d0;
  undefined4 local_7cc;
  undefined4 local_7c8;
  undefined8 local_7c0;
  long local_7b8;
  long local_7b0;
  undefined8 local_7a8;
  undefined8 local_7a0;
  undefined8 local_798;
  undefined4 local_790;
  long local_788;
  undefined4 local_780;
  undefined4 local_77c;
  undefined4 local_778;
  undefined4 local_774;
  undefined4 local_770;
  undefined8 local_768;
  long local_760;
  int local_758;
  int local_754;
  undefined8 local_750;
  undefined8 local_748;
  undefined8 local_740;
  undefined4 local_738;
  long local_730;
  undefined4 local_728;
  undefined4 local_724;
  undefined4 local_720;
  undefined4 local_71c;
  undefined4 local_718;
  undefined8 local_710;
  long local_708;
  undefined4 local_6fc;
  undefined8 local_6f8;
  undefined8 local_6f0;
  undefined8 local_6e8;
  undefined4 local_6e0;
  long local_6d8;
  undefined4 local_6d0;
  undefined4 local_6cc;
  undefined4 local_6c8;
  undefined4 local_6c4;
  undefined4 local_6c0;
  undefined8 local_6b8;
  long local_6b0;
  int local_6a8;
  int local_6a4;
  long local_6a0;
  undefined4 local_694;
  long local_690;
  int local_684;
  int local_680;
  int local_67c;
  int local_678;
  int local_674;
  int local_670;
  long *local_660;
  long *local_658;
  long *local_650;
  long local_648;
  long local_638;
  long *local_630;
  undefined1 local_625;
  int local_624;
  undefined8 *local_618;
  undefined1 local_60d;
  int local_60c;
  undefined8 *local_600;
  undefined1 local_5f5;
  int local_5f4;
  undefined8 *local_5e8;
  undefined1 local_5dd;
  int local_5dc;
  undefined8 *local_5d0;
  undefined1 local_5c5;
  int local_5c4;
  undefined8 *local_5b8;
  undefined8 *local_5b0;
  undefined8 *local_5a8;
  undefined8 *local_5a0;
  undefined8 *local_598;
  undefined8 *local_590;
  undefined8 *local_560;
  undefined8 *local_558;
  undefined8 *local_550;
  undefined8 *local_548;
  undefined8 *local_540;
  undefined8 *local_538;
  undefined8 *local_530;
  undefined8 *local_528;
  binary_op_atan2 *local_520;
  undefined1 local_515;
  int local_514;
  undefined8 *local_508;
  undefined1 local_4f5;
  int local_4f4;
  undefined8 *local_4e8;
  undefined1 local_4d5;
  int local_4d4;
  undefined8 *local_4c8;
  undefined1 local_4b5;
  int local_4b4;
  undefined8 *local_4a8;
  undefined8 *local_498;
  undefined8 *local_490;
  undefined8 *local_488;
  undefined8 *local_480;
  long local_478;
  undefined4 local_46c;
  long local_468;
  long local_460;
  undefined4 local_454;
  int local_450;
  int local_44c;
  undefined8 *local_448;
  long local_440;
  undefined4 local_434;
  long local_430;
  long local_428;
  undefined4 local_41c;
  int local_418;
  int local_414;
  undefined8 *local_410;
  long local_408;
  undefined4 local_3fc;
  long local_3f8;
  long local_3f0;
  undefined4 local_3e4;
  int local_3e0;
  int local_3dc;
  undefined8 *local_3d8;
  long local_3d0;
  undefined4 local_3c4;
  long local_3c0;
  float *local_3b8;
  undefined4 local_3ac;
  int local_3a8;
  int local_3a4;
  undefined8 *local_3a0;
  long local_398;
  undefined4 local_38c;
  long local_388;
  long local_380;
  undefined4 local_374;
  int local_370;
  int local_36c;
  undefined8 *local_368;
  long local_360;
  undefined4 local_354;
  long local_350;
  long local_348;
  undefined4 local_33c;
  int local_338;
  int local_334;
  undefined8 *local_330;
  long local_328;
  undefined4 local_31c;
  long local_318;
  long local_310;
  undefined4 local_304;
  int local_300;
  int local_2fc;
  undefined8 *local_2f8;
  long local_2f0;
  undefined4 local_2e4;
  long local_2e0;
  long local_2d8;
  undefined4 local_2cc;
  int local_2c8;
  int local_2c4;
  undefined8 *local_2c0;
  long local_2b8;
  undefined4 local_2ac;
  long local_2a8;
  long local_2a0;
  undefined4 local_294;
  int local_290;
  int local_28c;
  undefined8 *local_288;
  undefined4 local_27c;
  long local_278;
  undefined4 local_26c;
  long local_268;
  undefined4 local_25c;
  long local_258;
  undefined4 local_24c;
  long local_248;
  undefined4 local_23c;
  long local_238;
  undefined4 local_22c;
  long local_228;
  undefined4 local_21c;
  long local_218;
  undefined4 local_20c;
  long local_208;
  undefined4 local_1fc;
  long local_1f8;
  binary_op_atan2 *local_1a8;
  undefined8 *local_198;
  undefined8 *local_188;
  undefined8 *local_178;
  undefined8 *local_168;
  undefined8 *local_158;
  undefined8 *local_148;
  undefined8 *local_138;
  undefined8 *local_128;
  int local_3c;
  int local_2c;
  int local_1c;
  long *local_18;
  int local_c;
  long *local_8;
  
  local_670 = *(int *)((long)in_RDI + 0x2c);
  local_674 = (int)in_RDI[6];
  local_678 = *(int *)((long)in_RDI + 0x34);
  local_67c = (int)in_RDI[7];
  local_680 = local_670 * local_674 * local_678;
  local_660 = in_RDX;
  local_658 = in_RSI;
  local_650 = in_RDI;
  if (((int)in_RDI[5] == 2) && ((int)in_RSI[5] == 1)) {
    for (local_684 = 0; local_684 < local_674; local_684 = local_684 + 1) {
      local_18 = local_650;
      local_1c = local_684;
      local_690 = *local_650 +
                  (long)*(int *)((long)local_650 + 0x2c) * (long)local_684 * local_650[2];
      local_638 = (long)local_684;
      local_630 = local_658;
      local_694 = *(undefined4 *)(*local_658 + local_638 * 4);
      local_8 = local_660;
      local_c = local_684;
      local_6a0 = *local_660 +
                  (long)*(int *)((long)local_660 + 0x2c) * (long)local_684 * local_660[2];
      for (local_6a4 = 0; local_6a4 < local_670; local_6a4 = local_6a4 + 1) {
        fVar1 = binary_op_atan2::operator()
                          (in_stack_fffffffffffff4d0,in_stack_fffffffffffff4c8,(float *)0x101b96a);
        *(float *)(local_6a0 + (long)local_6a4 * 4) = fVar1;
      }
    }
  }
  if ((((int)local_650[5] == 3) || ((int)local_650[5] == 4)) && ((int)local_658[5] == 1)) {
    for (local_6a8 = 0; local_6a8 < local_67c; local_6a8 = local_6a8 + 1) {
      local_5b8 = &local_6f8;
      local_36c = *(int *)((long)local_650 + 0x2c);
      local_370 = (int)local_650[6];
      local_374 = *(undefined4 *)((long)local_650 + 0x34);
      local_6b0 = *local_650 + local_650[8] * (long)local_6a8 * local_650[2];
      local_388 = local_650[2];
      local_38c = (undefined4)local_650[3];
      local_398 = local_650[4];
      local_368 = &local_6f8;
      local_238 = (long)local_36c * (long)local_370 * local_388;
      local_590 = &local_6f8;
      local_560 = &local_6f8;
      local_648 = (long)local_6a8;
      local_6fc = *(undefined4 *)(*local_658 + local_648 * 4);
      local_4a8 = &local_750;
      local_44c = *(int *)((long)local_660 + 0x2c);
      local_450 = (int)local_660[6];
      local_454 = *(undefined4 *)((long)local_660 + 0x34);
      local_708 = *local_660 + local_660[8] * (long)local_6a8 * local_660[2];
      local_468 = local_660[2];
      local_46c = (undefined4)local_660[3];
      local_478 = local_660[4];
      local_448 = &local_750;
      local_1f8 = (long)local_44c * (long)local_450 * local_468;
      local_480 = &local_750;
      local_558 = &local_750;
      local_6c0 = 0;
      local_6c4 = 0;
      local_6c8 = 0;
      local_6cc = 0;
      local_6e0 = 0;
      local_6e8 = 0;
      local_6f0 = 0;
      local_6f8 = 0;
      local_1fc = 0x10;
      local_23c = 0x10;
      local_4b4 = local_6a8;
      local_4b5 = 1;
      local_5c4 = local_6a8;
      local_5c5 = 1;
      local_6b8 = 0;
      local_6d0 = 0;
      local_750 = 0;
      local_740 = 0;
      local_738 = 0;
      local_728 = 0;
      local_724 = 0;
      local_720 = 0;
      local_71c = 0;
      local_718 = 0;
      local_710 = 0;
      local_748 = 0;
      local_460 = local_708;
      local_380 = local_6b0;
      local_138 = local_558;
      local_128 = local_560;
      local_730 = local_478;
      local_6d8 = local_398;
      for (local_754 = 0; local_754 < local_680; local_754 = local_754 + 1) {
        fVar1 = binary_op_atan2::operator()
                          (in_stack_fffffffffffff4d0,in_stack_fffffffffffff4c8,(float *)0x101c31f);
        *(float *)(local_708 + (long)local_754 * 4) = fVar1;
      }
    }
  }
  if (((int)local_650[5] == 3) && ((int)local_658[5] == 2)) {
    for (local_758 = 0; local_758 < local_67c; local_758 = local_758 + 1) {
      local_5d0 = &local_7a8;
      local_334 = *(int *)((long)local_650 + 0x2c);
      local_338 = (int)local_650[6];
      local_33c = *(undefined4 *)((long)local_650 + 0x34);
      local_760 = *local_650 + local_650[8] * (long)local_758 * local_650[2];
      local_350 = local_650[2];
      local_354 = (undefined4)local_650[3];
      local_360 = local_650[4];
      local_330 = &local_7a8;
      local_248 = (long)local_334 * (long)local_338 * local_350;
      local_598 = &local_7a8;
      local_550 = &local_7a8;
      local_7b0 = *local_658 +
                  (long)*(int *)((long)local_658 + 0x2c) * (long)local_758 * local_658[2];
      local_4c8 = &local_800;
      local_414 = *(int *)((long)local_660 + 0x2c);
      local_418 = (int)local_660[6];
      local_41c = *(undefined4 *)((long)local_660 + 0x34);
      local_7b8 = *local_660 + local_660[8] * (long)local_758 * local_660[2];
      local_430 = local_660[2];
      local_434 = (undefined4)local_660[3];
      local_440 = local_660[4];
      local_410 = &local_800;
      local_208 = (long)local_414 * (long)local_418 * local_430;
      local_488 = &local_800;
      local_548 = &local_800;
      local_770 = 0;
      local_774 = 0;
      local_778 = 0;
      local_77c = 0;
      local_790 = 0;
      local_798 = 0;
      local_7a0 = 0;
      local_7a8 = 0;
      local_2c = local_758;
      local_20c = 0x10;
      local_24c = 0x10;
      local_4d4 = local_758;
      local_4d5 = 1;
      local_5dc = local_758;
      local_5dd = 1;
      local_768 = 0;
      local_780 = 0;
      local_800 = 0;
      local_7f0 = 0;
      local_7e8 = 0;
      local_7d8 = 0;
      local_7d4 = 0;
      local_7d0 = 0;
      local_7cc = 0;
      local_7c8 = 0;
      local_7c0 = 0;
      local_7f8 = 0;
      local_428 = local_7b8;
      local_348 = local_760;
      local_158 = local_548;
      local_148 = local_550;
      local_7e0 = local_440;
      local_788 = local_360;
      for (local_804 = 0; local_804 < local_674; local_804 = local_804 + 1) {
        local_808 = *(undefined4 *)(local_7b0 + (long)local_804 * 4);
        for (local_80c = 0; local_80c < local_670; local_80c = local_80c + 1) {
          fVar1 = binary_op_atan2::operator()
                            (in_stack_fffffffffffff4d0,in_stack_fffffffffffff4c8,(float *)0x101cd0b)
          ;
          *(float *)(local_7b8 + (long)local_80c * 4) = fVar1;
        }
        local_760 = local_760 + (long)local_670 * 4;
        local_7b8 = local_7b8 + (long)local_670 * 4;
      }
    }
  }
  if (((int)local_650[5] == 4) && ((int)local_658[5] == 2)) {
    for (local_810 = 0; local_810 < local_67c; local_810 = local_810 + 1) {
      local_5e8 = &local_860;
      local_2fc = *(int *)((long)local_650 + 0x2c);
      local_300 = (int)local_650[6];
      local_304 = *(undefined4 *)((long)local_650 + 0x34);
      local_818 = *local_650 + local_650[8] * (long)local_810 * local_650[2];
      local_318 = local_650[2];
      local_31c = (undefined4)local_650[3];
      local_328 = local_650[4];
      local_2f8 = &local_860;
      local_258 = (long)local_2fc * (long)local_300 * local_318;
      local_5a0 = &local_860;
      local_540 = &local_860;
      local_868 = *local_658 +
                  (long)*(int *)((long)local_658 + 0x2c) * (long)local_810 * local_658[2];
      local_4e8 = &local_8b8;
      local_3dc = *(int *)((long)local_660 + 0x2c);
      local_3e0 = (int)local_660[6];
      local_3e4 = *(undefined4 *)((long)local_660 + 0x34);
      local_870 = *local_660 + local_660[8] * (long)local_810 * local_660[2];
      local_3f8 = local_660[2];
      local_3fc = (undefined4)local_660[3];
      local_408 = local_660[4];
      local_3d8 = &local_8b8;
      local_218 = (long)local_3dc * (long)local_3e0 * local_3f8;
      local_490 = &local_8b8;
      local_538 = &local_8b8;
      local_828 = 0;
      local_82c = 0;
      local_830 = 0;
      local_834 = 0;
      local_848 = 0;
      local_850 = 0;
      local_858 = 0;
      local_860 = 0;
      local_3c = local_810;
      local_21c = 0x10;
      local_25c = 0x10;
      local_4f4 = local_810;
      local_4f5 = 1;
      local_5f4 = local_810;
      local_5f5 = 1;
      local_820 = 0;
      local_838 = 0;
      local_8b8 = 0;
      local_8a8 = 0;
      local_8a0 = 0;
      local_890 = 0;
      local_88c = 0;
      local_888 = 0;
      local_884 = 0;
      local_880 = 0;
      local_878 = 0;
      local_8b0 = 0;
      local_3f0 = local_870;
      local_310 = local_818;
      local_178 = local_538;
      local_168 = local_540;
      local_898 = local_408;
      local_840 = local_328;
      for (local_8bc = 0; local_8bc < local_678; local_8bc = local_8bc + 1) {
        local_8c0 = *(undefined4 *)(local_868 + (long)local_8bc * 4);
        for (local_8c4 = 0; local_8c4 < local_674; local_8c4 = local_8c4 + 1) {
          for (local_8c8 = 0; local_8c8 < local_670; local_8c8 = local_8c8 + 1) {
            fVar1 = binary_op_atan2::operator()
                              (in_stack_fffffffffffff4d0,in_stack_fffffffffffff4c8,
                               (float *)0x101d768);
            *(float *)(local_870 + (long)local_8c8 * 4) = fVar1;
          }
          local_818 = local_818 + (long)local_670 * 4;
          local_870 = local_870 + (long)local_670 * 4;
        }
      }
    }
  }
  if (((int)local_650[5] == 4) && ((int)local_658[5] == 3)) {
    for (local_8cc = 0; local_8cc < local_67c; local_8cc = local_8cc + 1) {
      local_600 = &local_920;
      local_2c4 = *(int *)((long)local_650 + 0x2c);
      local_2c8 = (int)local_650[6];
      local_2cc = *(undefined4 *)((long)local_650 + 0x34);
      local_8d8 = *local_650 + local_650[8] * (long)local_8cc * local_650[2];
      local_2e0 = local_650[2];
      local_2e4 = (undefined4)local_650[3];
      local_2f0 = local_650[4];
      local_2c0 = &local_920;
      local_268 = (long)local_2c4 * (long)local_2c8 * local_2e0;
      local_5a8 = &local_920;
      local_530 = &local_920;
      local_618 = &local_970;
      local_28c = *(int *)((long)local_658 + 0x2c);
      local_290 = (int)local_658[6];
      local_294 = *(undefined4 *)((long)local_658 + 0x34);
      local_928 = *local_658 + local_658[8] * (long)local_8cc * local_658[2];
      local_2a8 = local_658[2];
      local_2ac = (undefined4)local_658[3];
      local_2b8 = local_658[4];
      local_288 = &local_970;
      local_278 = (long)local_28c * (long)local_290 * local_2a8;
      local_5b0 = &local_970;
      local_528 = &local_970;
      local_508 = &local_9c0;
      local_3a4 = *(int *)((long)local_660 + 0x2c);
      local_3a8 = (int)local_660[6];
      local_3ac = *(undefined4 *)((long)local_660 + 0x34);
      x_00 = (float *)(*local_660 + local_660[8] * (long)local_8cc * local_660[2]);
      local_3c0 = local_660[2];
      local_3c4 = (undefined4)local_660[3];
      local_3d0 = local_660[4];
      local_3a0 = &local_9c0;
      local_228 = (long)local_3a4 * (long)local_3a8 * local_3c0;
      local_498 = &local_9c0;
      this = (binary_op_atan2 *)&local_9c0;
      local_8e8 = 0;
      local_8ec = 0;
      local_8f0 = 0;
      local_8f4 = 0;
      local_908 = 0;
      local_910 = 0;
      local_918 = 0;
      local_920 = 0;
      local_938 = 0;
      local_93c = 0;
      local_940 = 0;
      local_944 = 0;
      local_958 = 0;
      local_960 = 0;
      local_968 = 0;
      local_970 = 0;
      local_22c = 0x10;
      local_26c = 0x10;
      local_27c = 0x10;
      local_514 = local_8cc;
      local_515 = 1;
      local_60c = local_8cc;
      local_60d = 1;
      local_624 = local_8cc;
      local_625 = 1;
      local_8e0 = 0;
      local_8f8 = 0;
      local_930 = 0;
      local_948 = 0;
      local_9c0 = 0;
      local_9b0 = 0;
      local_9a8 = 0;
      local_998 = 0;
      local_994 = 0;
      local_990 = 0;
      local_98c = 0;
      local_988 = 0;
      local_980 = 0;
      local_9b8 = 0;
      local_978 = x_00;
      local_520 = this;
      local_3b8 = x_00;
      local_2d8 = local_8d8;
      local_2a0 = local_928;
      local_1a8 = this;
      local_198 = local_528;
      local_188 = local_530;
      local_9a0 = local_3d0;
      local_950 = local_2b8;
      local_900 = local_2f0;
      for (local_9c4 = 0; local_9c4 < local_678; local_9c4 = local_9c4 + 1) {
        for (local_9c8 = 0; local_9c8 < local_674; local_9c8 = local_9c8 + 1) {
          for (local_9d0 = 0; local_9d0 < local_670; local_9d0 = local_9d0 + 1) {
            fVar1 = binary_op_atan2::operator()(this,x_00,(float *)0x101e543);
            local_978[local_9d0] = fVar1;
          }
          local_8d8 = local_8d8 + (long)local_670 * 4;
          local_978 = local_978 + local_670;
        }
        local_928 = local_928 + (long)local_674 * 4;
      }
    }
  }
  return 0;
}

Assistant:

static int binary_op_broadcast_inner(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int size = w * h * d;

    if (a.dims == 2 && b.dims == 1)
    {
        // type 12
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int y = 0; y < h; y++)
        {
            const float* ptr = a.row(y);
            const float b0 = b[y];
            float* outptr = c.row(y);

            for (int x = 0; x < w; x++)
            {
                outptr[x] = op(ptr[x], b0);
            }
        }
    }

    if ((a.dims == 3 || a.dims == 4) && b.dims == 1)
    {
        // type 9 11
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = a.channel(q);
            const float b0 = b[q];
            float* outptr = c.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = op(ptr[i], b0);
            }
        }
    }

    if (a.dims == 3 && b.dims == 2)
    {
        // type 10
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = a.channel(q);
            const float* ptr1 = b.row(q);
            float* outptr = c.channel(q);

            for (int y = 0; y < h; y++)
            {
                const float b0 = ptr1[y];
                for (int x = 0; x < w; x++)
                {
                    outptr[x] = op(ptr[x], b0);
                }

                ptr += w;
                outptr += w;
            }
        }
    }

    if (a.dims == 4 && b.dims == 2)
    {
        // type 12
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = a.channel(q);
            const float* ptr1 = b.row(q);
            float* outptr = c.channel(q);

            for (int z = 0; z < d; z++)
            {
                const float b0 = ptr1[z];
                for (int y = 0; y < h; y++)
                {
                    for (int x = 0; x < w; x++)
                    {
                        outptr[x] = op(ptr[x], b0);
                    }

                    ptr += w;
                    outptr += w;
                }
            }
        }
    }

    if (a.dims == 4 && b.dims == 3)
    {
        // type 13
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = a.channel(q);
            const float* ptr1 = b.channel(q);
            float* outptr = c.channel(q);

            for (int z = 0; z < d; z++)
            {
                for (int y = 0; y < h; y++)
                {
                    const float b0 = ptr1[y];
                    for (int x = 0; x < w; x++)
                    {
                        outptr[x] = op(ptr[x], b0);
                    }

                    ptr += w;
                    outptr += w;
                }

                ptr1 += h;
            }
        }
    }

    return 0;
}